

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_extend(HSQUIRRELVM v)

{
  SQArray *this;
  SQObjectPtr *pSVar1;
  
  pSVar1 = stack_get(v,1);
  this = (pSVar1->super_SQObject)._unVal.pArray;
  pSVar1 = stack_get(v,2);
  SQArray::Extend(this,(pSVar1->super_SQObject)._unVal.pArray);
  sq_pop(v,1);
  return 1;
}

Assistant:

static SQInteger array_extend(HSQUIRRELVM v)
{
    _array(stack_get(v,1))->Extend(_array(stack_get(v,2)));
    sq_pop(v,1);
    return 1;
}